

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomProcessingInstructionPrivate * __thiscall
QDomDocumentPrivate::createProcessingInstruction
          (QDomDocumentPrivate *this,QString *target,QString *data)

{
  long lVar1;
  bool *in_RDX;
  QString *in_RSI;
  long in_FS_OFFSET;
  QDomProcessingInstructionPrivate *p;
  QString fixedTarget;
  QString fixedData;
  bool ok;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fixedPIData(in_RSI,in_RDX);
  QString::~QString((QString *)0x11b82b);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDomProcessingInstructionPrivate *)0x0;
}

Assistant:

QDomProcessingInstructionPrivate* QDomDocumentPrivate::createProcessingInstruction(const QString &target,
                                                                                   const QString &data)
{
    bool ok;
    QString fixedData = fixedPIData(data, &ok);
    if (!ok)
        return nullptr;
    // [17] PITarget ::= Name - (('X' | 'x') ('M' | 'm') ('L' | 'l'))
    QString fixedTarget = fixedXmlName(target, &ok);
    if (!ok)
        return nullptr;

    QDomProcessingInstructionPrivate *p = new QDomProcessingInstructionPrivate(this, nullptr, fixedTarget, fixedData);
    p->ref.deref();
    return p;
}